

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdCreateAddress(void *handle,int hash_type,char *pubkey,char *redeem_script,int network_type,
                    char **address,char **locking_script,char **p2sh_segwit_locking_script)

{
  pointer pcVar1;
  bool bVar2;
  NetType type;
  AddressType address_type;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  CfdException *this;
  Pubkey pubkey_obj;
  char *work_locking_script;
  char *work_address;
  Script lock_script;
  Script script;
  Script unlocking_script;
  Address addr;
  bool local_4b9;
  undefined1 local_4b8 [16];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_4a8;
  void *local_490;
  Pubkey local_488;
  char *local_470;
  char *local_468;
  char **local_460;
  SchnorrPubkey local_458;
  ByteData local_440;
  ByteData local_428;
  ByteData local_410;
  Pubkey local_3f8;
  undefined8 local_3e0;
  Script local_3d8;
  undefined1 local_3a0 [384];
  Script local_220;
  Script local_1e8;
  Address local_1b0;
  
  local_468 = (char *)0x0;
  local_470 = (char *)0x0;
  local_3e0 = 0;
  local_490 = handle;
  cfd::Initialize();
  local_460 = address;
  if (address == (char **)0x0) {
    local_1b0._0_8_ = "cfdcapi_address.cpp";
    local_1b0.witness_ver_ = 0x8f;
    local_1b0.address_._M_dataplus._M_p = "CfdCreateAddress";
    cfd::core::logger::log<>((CfdSourceLocation *)&local_1b0,kCfdLogLevelWarning,"address is null.")
    ;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = &local_1b0.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"Failed to parameter. address is null.","");
    cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_1b0);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_4b9 = false;
  type = cfd::capi::ConvertNetType(network_type,&local_4b9);
  cfd::core::Address::Address(&local_1b0);
  address_type = cfd::capi::ConvertHashToAddressType(0);
  cfd::core::Pubkey::Pubkey(&local_488);
  cfd::core::Script::Script(&local_220);
  cfd::core::Script::Script(&local_3d8);
  cfd::core::Script::Script(&local_1e8);
  if ((pubkey != (char *)0x0) && (*pubkey != '\0')) {
    if (address_type == kTaprootAddress) {
      local_3a0._0_8_ = local_3a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"02","");
      cfd::core::ByteData::ByteData(&local_428,(string *)local_3a0);
      local_4b8._0_8_ = &local_4a8;
      sVar3 = strlen(pubkey);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,pubkey,pubkey + sVar3);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&local_458,(string *)local_4b8);
      cfd::core::SchnorrPubkey::GetData(&local_440,&local_458);
      cfd::core::ByteData::Concat<cfd::core::ByteData>(&local_410,&local_428,&local_440);
      cfd::core::Pubkey::Pubkey(&local_3f8,&local_410);
      cfd::core::ByteData::operator=(&local_488.data_,&local_3f8.data_);
      if (local_3f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_3f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_410.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_410.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_410.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_410.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_440.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_440.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_440.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_458.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_458.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
          local_4b8._0_8_ != &local_4a8) {
        operator_delete((void *)local_4b8._0_8_,
                        (ulong)((long)local_4a8.
                                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_428.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_428.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_428.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_3a0._0_8_ == local_3a0 + 0x10) goto LAB_004046fa;
    }
    else {
      local_3a0._0_8_ = local_3a0 + 0x10;
      sVar3 = strlen(pubkey);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,pubkey,pubkey + sVar3);
      cfd::core::Pubkey::Pubkey((Pubkey *)local_4b8,(string *)local_3a0);
      cfd::core::ByteData::operator=(&local_488.data_,(ByteData *)local_4b8);
      if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
          local_4b8._0_8_ !=
          (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0
         ) {
        operator_delete((void *)local_4b8._0_8_,
                        (long)local_4a8.
                              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                              ._M_impl.super__Vector_impl_data._M_start - local_4b8._0_8_);
      }
      if ((undefined1 *)local_3a0._0_8_ == local_3a0 + 0x10) goto LAB_004046fa;
    }
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
LAB_004046fa:
  if ((redeem_script != (char *)0x0) && (*redeem_script != '\0')) {
    local_4b8._0_8_ = &local_4a8;
    sVar3 = strlen(redeem_script);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b8,redeem_script,redeem_script + sVar3);
    cfd::core::Script::Script((Script *)local_3a0,(string *)local_4b8);
    cfd::core::Script::operator=(&local_220,(Script *)local_3a0);
    cfd::core::Script::~Script((Script *)local_3a0);
    if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
        local_4b8._0_8_ != &local_4a8) {
      operator_delete((void *)local_4b8._0_8_,
                      (ulong)((long)local_4a8.
                                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  if (local_4b9 == true) {
    cfd::AddressFactory::AddressFactory((AddressFactory *)local_4b8,type);
    cfd::AddressFactory::CreateAddress
              ((Address *)local_3a0,(AddressFactory *)local_4b8,address_type,&local_488,&local_220,
               &local_3d8,&local_1e8);
    cfd::core::Address::operator=(&local_1b0,(Address *)local_3a0);
  }
  else {
    cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_4b8,type);
    cfd::AddressFactory::CreateAddress
              ((Address *)local_3a0,(AddressFactory *)local_4b8,address_type,&local_488,&local_220,
               &local_3d8,&local_1e8);
    cfd::core::Address::operator=(&local_1b0,(Address *)local_3a0);
  }
  cfd::core::Address::~Address((Address *)local_3a0);
  local_4b8._0_8_ = &PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_4a8);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_3a0,&local_1b0);
  pcVar4 = cfd::capi::CreateString((string *)local_3a0);
  pcVar1 = local_3a0 + 0x10;
  local_468 = pcVar4;
  if ((pointer)local_3a0._0_8_ != pcVar1) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  if ((locking_script == (char **)0x0) || (bVar2 = cfd::core::Script::IsEmpty(&local_3d8), bVar2)) {
    pcVar5 = (char *)0x0;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_3a0,&local_3d8);
    pcVar5 = cfd::capi::CreateString((string *)local_3a0);
    local_470 = pcVar5;
    if ((pointer)local_3a0._0_8_ != pcVar1) {
      operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
    }
  }
  if ((p2sh_segwit_locking_script == (char **)0x0) ||
     (bVar2 = cfd::core::Script::IsEmpty(&local_1e8), bVar2)) {
    pcVar6 = (char *)0x0;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_3a0,&local_1e8);
    pcVar6 = cfd::capi::CreateString((string *)local_3a0);
    if ((pointer)local_3a0._0_8_ != pcVar1) {
      operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
    }
  }
  *local_460 = pcVar4;
  if (pcVar5 != (char *)0x0) {
    *locking_script = pcVar5;
  }
  if (pcVar6 != (char *)0x0) {
    *p2sh_segwit_locking_script = pcVar6;
  }
  cfd::core::Script::~Script(&local_1e8);
  cfd::core::Script::~Script(&local_3d8);
  cfd::core::Script::~Script(&local_220);
  if (local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_488.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_1b0);
  return 0;
}

Assistant:

int CfdCreateAddress(
    void* handle, int hash_type, const char* pubkey, const char* redeem_script,
    int network_type, char** address, char** locking_script,
    char** p2sh_segwit_locking_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_locking_script = nullptr;
  char* work_p2sh_segwit_locking_script = nullptr;
  try {
    cfd::Initialize();
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Pubkey pubkey_obj;
    Script script;
    Script lock_script;
    Script unlocking_script;

    if ((pubkey != nullptr) && (*pubkey != '\0')) {
      if (addr_type == AddressType::kTaprootAddress) {
        pubkey_obj =
            Pubkey(ByteData("02").Concat(SchnorrPubkey(pubkey).GetData()));
      } else {
        pubkey_obj = Pubkey(pubkey);
      }
    }
    if ((redeem_script != nullptr) && (*redeem_script != '\0')) {
      script = Script(redeem_script);
    }

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    work_address = CreateString(addr.GetAddress());
    if (locking_script != nullptr) {
      if (!lock_script.IsEmpty()) {
        work_locking_script = CreateString(lock_script.GetHex());
      }
    }
    if (p2sh_segwit_locking_script != nullptr) {
      if (!unlocking_script.IsEmpty()) {
        work_p2sh_segwit_locking_script =
            CreateString(unlocking_script.GetHex());
      }
    }

    *address = work_address;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_p2sh_segwit_locking_script != nullptr)
      *p2sh_segwit_locking_script = work_p2sh_segwit_locking_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_address, &work_locking_script, &work_p2sh_segwit_locking_script);
  return result;
}